

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

opj_bool t2_skip_packet_data(opj_t2_v2_t *p_t2,opj_tcd_tile_v2_t *p_tile,opj_pi_iterator_t *p_pi,
                            OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_length,
                            opj_packet_info_t *pack_info)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  opj_tcd_resolution_v2_t *poVar5;
  opj_tcd_precinct_v2_t *poVar6;
  opj_tcd_seg_t *l_seg;
  opj_tcd_precinct_v2_t *l_prc;
  opj_tcd_resolution_v2_t *l_res;
  opj_tcd_cblk_dec_v2_t *l_cblk;
  opj_tcd_band_v2_t *l_band;
  OPJ_UINT32 l_nb_code_blocks;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 bandno;
  opj_packet_info_t *pack_info_local;
  OPJ_UINT32 p_max_length_local;
  OPJ_UINT32 *p_data_read_local;
  opj_pi_iterator_t *p_pi_local;
  opj_tcd_tile_v2_t *p_tile_local;
  opj_t2_v2_t *p_t2_local;
  
  poVar5 = p_tile->comps[p_pi->compno].resolutions;
  iVar1 = p_pi->resno;
  *p_data_read = 0;
  l_band = poVar5[iVar1].bands;
  bandno = 0;
  do {
    if (poVar5[iVar1].numbands <= bandno) {
      return 1;
    }
    poVar6 = l_band->precincts;
    iVar2 = p_pi->precno;
    if ((l_band->x1 != l_band->x0) && (l_band->y1 != l_band->y0)) {
      OVar3 = poVar6[iVar2].cw;
      OVar4 = poVar6[iVar2].ch;
      l_cblk = poVar6[iVar2].cblks.dec;
      for (cblkno = 0; cblkno < OVar3 * OVar4; cblkno = cblkno + 1) {
        if (l_cblk->numnewpasses != 0) {
          if (l_cblk->numsegs == 0) {
            l_seg = l_cblk->segs;
            l_cblk->numsegs = l_cblk->numsegs + 1;
            l_cblk->len = 0;
          }
          else {
            l_seg = l_cblk->segs + (l_cblk->numsegs - 1);
            if (l_seg->numpasses == l_seg->maxpasses) {
              l_seg = l_seg + 1;
              l_cblk->numsegs = l_cblk->numsegs + 1;
            }
          }
          do {
            if (p_max_length < *p_data_read + l_seg->newlen) {
              return 0;
            }
            *p_data_read = l_seg->newlen + *p_data_read;
            l_seg->numpasses = l_seg->numnewpasses + l_seg->numpasses;
            l_cblk->numnewpasses = l_cblk->numnewpasses - l_seg->numnewpasses;
            if (l_cblk->numnewpasses != 0) {
              l_seg = l_seg + 1;
              l_cblk->numsegs = l_cblk->numsegs + 1;
            }
          } while (l_cblk->numnewpasses != 0);
        }
        l_cblk = l_cblk + 1;
      }
    }
    l_band = l_band + 1;
    bandno = bandno + 1;
  } while( true );
}

Assistant:

static opj_bool t2_skip_packet_data(
							 opj_t2_v2_t* p_t2,
							 opj_tcd_tile_v2_t *p_tile,
							 opj_pi_iterator_t *p_pi,
							 OPJ_UINT32 * p_data_read,
							 OPJ_UINT32 p_max_length,
							 opj_packet_info_t *pack_info)
{
	OPJ_UINT32 bandno, cblkno;
	OPJ_UINT32 l_nb_code_blocks;
	opj_tcd_band_v2_t *l_band = 00;
	opj_tcd_cblk_dec_v2_t* l_cblk = 00;
	opj_tcd_resolution_v2_t* l_res = &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

	*p_data_read = 0;
	l_band = l_res->bands;

	for (bandno = 0; bandno < l_res->numbands; ++bandno) {
		opj_tcd_precinct_v2_t *l_prc = &l_band->precincts[p_pi->precno];

		if ((l_band->x1-l_band->x0 == 0)||(l_band->y1-l_band->y0 == 0)) {
			++l_band;
			continue;
		}

		l_nb_code_blocks = l_prc->cw * l_prc->ch;
		l_cblk = l_prc->cblks.dec;

		for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
			opj_tcd_seg_t *l_seg = 00;

			if (!l_cblk->numnewpasses) {
				/* nothing to do */
				++l_cblk;
				continue;
			}

			if (!l_cblk->numsegs) {
				l_seg = l_cblk->segs;
				++l_cblk->numsegs;
				l_cblk->len = 0;
			}
			else {
				l_seg = &l_cblk->segs[l_cblk->numsegs - 1];

				if (l_seg->numpasses == l_seg->maxpasses) {
					++l_seg;
					++l_cblk->numsegs;
				}
			}

			do {
				if (* p_data_read + l_seg->newlen > p_max_length) {
					return OPJ_FALSE;
				}

#ifdef USE_JPWL
			/* we need here a j2k handle to verify if making a check to
			the validity of cblocks parameters is selected from user (-W) */

				/* let's check that we are not exceeding */
				if ((l_cblk->len + l_seg->newlen) > 8192) {
					opj_event_msg(p_t2->cinfo, EVT_WARNING,
						"JPWL: segment too long (%d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n",
						l_seg->newlen, cblkno, p_pi->precno, bandno, p_pi->resno, p_pi->compno);
					if (!JPWL_ASSUME) {
						opj_event_msg(p_t2->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return -999;
					}
					l_seg->newlen = 8192 - l_cblk->len;
					opj_event_msg(p_t2->cinfo, EVT_WARNING, "      - truncating segment to %d\n", l_seg->newlen);
					break;
				};

#endif /* USE_JPWL */
				*(p_data_read) += l_seg->newlen;

				l_seg->numpasses += l_seg->numnewpasses;
				l_cblk->numnewpasses -= l_seg->numnewpasses;
				if (l_cblk->numnewpasses > 0)
				{
					++l_seg;
					++l_cblk->numsegs;
				}
			} while (l_cblk->numnewpasses > 0);

			++l_cblk;
		}

		++l_band;
	}

	return OPJ_TRUE;
}